

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O2

void __thiscall pools::~pools(pools *this)

{
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->async).
              super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->sync).
              super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

pools() : async_requested(false) {}